

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O2

string * __thiscall
glcts::TextureBufferOperationsViaFrambufferReadBack::getFBFragmentShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferOperationsViaFrambufferReadBack *this)

{
  stringstream strstream;
  stringstream local_190 [16];
  ostream local_180;
  
  std::__cxx11::stringstream::stringstream(local_190);
  std::operator<<(&local_180,
                  "${VERSION}\n\nprecision highp float;\n\nout ivec4 color;\n\nvoid main(void)\n{\n    color = ivec4(0, 1, 0, 1);\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferOperationsViaFrambufferReadBack::getFBFragmentShaderCode() const
{
	std::stringstream strstream;

	strstream << "${VERSION}\n"
				 "\n"
				 "precision highp float;\n"
				 "\n"
				 "out ivec4 color;\n"
				 "\n"
				 "void main(void)\n"
				 "{\n"
				 "    color = ivec4(0, 1, 0, 1);\n"
				 "}\n";

	return strstream.str();
}